

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O2

double logsum2(double a,double b)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  
  if (((a != 1000.0) || (dVar2 = b, NAN(a))) && ((b != 1000.0 || (dVar2 = a, NAN(b))))) {
    dVar2 = a - b;
    dVar3 = b - a;
    bVar1 = b < a;
    if (a <= b) {
      a = b;
    }
    dVar2 = exp((double)(~-(ulong)bVar1 & (ulong)dVar2 | (ulong)dVar3 & -(ulong)bVar1));
    dVar2 = log(dVar2 + 1.0);
    dVar2 = dVar2 + a;
  }
  return dVar2;
}

Assistant:

double logsum2(double a, double b)
{
    if(a==1000)
        return b;
    else if(b==1000)
        return a;
    else if(a>b)
        return a + log(1 + exp(b-a));
    else
        return b + log(1 + exp(a-b));
}